

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O1

wchar_t pfdistances_to_path(pfdistances *a,loc_conflict grid,int16_t **step_dirs)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  wchar_t wVar5;
  loc_conflict lVar6;
  ulong uVar7;
  loc_conflict grid1;
  wchar_t wVar8;
  wchar_t wVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int16_t *local_60;
  
  if (-1 < (long)grid && a != (pfdistances *)0x0) {
    uVar12 = (ulong)grid >> 0x20;
    wVar8 = grid.x;
    if (((L'\xffffffff' < wVar8 && grid.y < a->height) && (wVar8 < a->width)) &&
       (-1 < a->rows[uVar12][(uint)(wVar8 & 0x7fffffff)])) {
      _Var2 = loc_eq(grid,a->start);
      if (_Var2) {
        if (step_dirs == (int16_t **)0x0) {
          return L'\0';
        }
        *step_dirs = (int16_t *)0x0;
        return L'\0';
      }
      iVar3 = grid.y - (a->start).y;
      iVar11 = -iVar3;
      if (0 < iVar3) {
        iVar11 = iVar3;
      }
      iVar4 = wVar8 - (a->start).x;
      iVar3 = -iVar4;
      if (0 < iVar4) {
        iVar3 = iVar4;
      }
      wVar9 = iVar11 + iVar3 + L'\x02';
      local_60 = (int16_t *)mem_alloc((ulong)((iVar11 + iVar3) * 2 + 4));
      wVar8 = L'\0';
      do {
        grid1 = (loc_conflict)((ulong)grid & 0xffffffff | uVar12 << 0x20);
        _Var2 = loc_eq(grid1,a->start);
        if (_Var2) {
          if (step_dirs != (int16_t **)0x0) {
            *step_dirs = local_60;
            return wVar8;
          }
          mem_free(local_60);
          return wVar8;
        }
        iVar11 = a->rows[(int)uVar12][grid.x];
        uVar7 = 0xffffffff;
        uVar10 = 0;
        do {
          lVar6 = loc_sum(grid1,(loc_conflict)ddgrid_ddd[uVar10]);
          if ((((long)lVar6 < 0) || (wVar5 = lVar6.x, wVar5 < L'\0')) ||
             ((a->height <= lVar6.y || (a->width <= wVar5)))) {
            __assert_fail("next.y >= 0 && next.y < a->height && next.x >= 0 && next.x < a->width",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                          ,0x247,
                          "int pfdistances_to_path(const struct pfdistances *, struct loc, int16_t **)"
                         );
          }
          iVar3 = a->rows[(ulong)lVar6 >> 0x20][(uint)(wVar5 & 0x7fffffff)];
          if (-1 < iVar3 && iVar3 < iVar11) {
            uVar7 = uVar10 & 0xffffffff;
            iVar11 = iVar3;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != 8);
        if ((int)uVar7 < 0) {
          mem_free(local_60);
joined_r0x001bb064:
          if (step_dirs != (int16_t **)0x0) {
            *step_dirs = (int16_t *)0x0;
          }
          bVar1 = false;
        }
        else {
          if (wVar9 < wVar8) {
            __assert_fail("length <= allocated && allocated > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                          ,0x25a,
                          "int pfdistances_to_path(const struct pfdistances *, struct loc, int16_t **)"
                         );
          }
          wVar5 = wVar9;
          if (wVar8 == wVar9) {
            if (L'\x3fffffff' < wVar9) {
              mem_free(local_60);
              goto joined_r0x001bb064;
            }
            wVar5 = wVar9 * 2;
            local_60 = (int16_t *)mem_realloc(local_60,(ulong)(uint)(wVar9 << 2));
          }
          local_60[wVar8] = 10 - ddd[uVar7];
          wVar8 = wVar8 + L'\x01';
          grid = loc_sum(grid1,(loc_conflict)ddgrid_ddd[uVar7]);
          uVar12 = (ulong)grid >> 0x20;
          bVar1 = true;
          wVar9 = wVar5;
        }
        if (!bVar1) {
          return L'\xffffffff';
        }
      } while( true );
    }
  }
  if (step_dirs != (int16_t **)0x0) {
    *step_dirs = (int16_t *)0x0;
  }
  return L'\xffffffff';
}

Assistant:

int pfdistances_to_path(const struct pfdistances *a, struct loc grid,
		int16_t **step_dirs)
{
	int16_t *steps;
	int allocated, length;

	if (!a || grid.y < 0 || grid.y >= a->height || grid.x < 0 ||
			grid.x >= a->width || a->rows[grid.y][grid.x] < 0) {
		if (step_dirs) {
			*step_dirs = NULL;
		}
		return -1;
	}
	if (loc_eq(grid, a->start)) {
		if (step_dirs) {
			*step_dirs = NULL;
		}
		return 0;
	}

	/* Work backwards from the destination to the starting point. */
	allocated = 2 + ABS(grid.y - a->start.y) + ABS(grid.x - a->start.x);
	length = 0;
	steps = mem_alloc(allocated * sizeof(*steps));
	while (!loc_eq(grid, a->start)) {
		int k, best_k = -1, best_distance = a->rows[grid.y][grid.x];

		/* Find the next step. */
		for (k = 0; k < 8; ++k) {
			struct loc next = loc_sum(grid, ddgrid_ddd[k]);
			int try_distance;

			/*
			 * The impassable boundary imposed on the distances
			 * array should mean the trial step is always in bounds.
			 */
			assert(next.y >= 0 && next.y < a->height
				&& next.x >= 0 && next.x < a->width);
			try_distance = a->rows[next.y][next.x];
			if (try_distance >= 0 && best_distance > try_distance) {
				best_distance = try_distance;
				best_k = k;
			}
		}

		/*
		 * Bail out if stepping backwards did not improve the distance.
		 */
		if (best_k < 0) {
			mem_free(steps);
			if (step_dirs) {
				*step_dirs = NULL;
			}
			return -1;
		}

		assert(length <= allocated && allocated > 0);
		if (length == allocated) {
			if (allocated > INT_MAX / 2
					|| (size_t)allocated
					> SIZE_MAX / (2 * sizeof(*steps))) {
				mem_free(steps);
				if (step_dirs) {
					*step_dirs = NULL;
				}
				return -1;
			}
			allocated *= 2;
			steps = mem_realloc(steps, allocated * sizeof(*steps));
		}

		/* Record the opposite of the backward direction. */
		steps[length] = 10 - ddd[best_k];
		++length;

		grid = loc_sum(grid, ddgrid_ddd[best_k]);
	}

	if (step_dirs) {
		*step_dirs = steps;
	} else {
		mem_free(steps);
	}
	return length;
}